

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O2

void lj_lex_error(LexState *ls,LexToken tok,ErrMsg em,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (tok == 0) {
    pcVar1 = (char *)0x0;
  }
  else if (tok - 0x11eU < 3) {
    pcVar1 = (ls->sb).w;
    if (*(int *)&(ls->sb).e == (int)pcVar1) {
      pcVar1 = lj_buf_more2(&ls->sb,1);
    }
    *pcVar1 = '\0';
    (ls->sb).w = pcVar1 + 1;
    pcVar1 = (ls->sb).b;
  }
  else {
    pcVar1 = lj_lex_token2str(ls,tok);
  }
  argp[0].reg_save_area = local_c8;
  argp[0].overflow_arg_area = &stack0x00000008;
  argp[0].gp_offset = 0x18;
  argp[0].fp_offset = 0x30;
  lj_err_lex(ls->L,ls->chunkname,pcVar1,ls->linenumber,em,argp);
}

Assistant:

void lj_lex_error(LexState *ls, LexToken tok, ErrMsg em, ...)
{
  const char *tokstr;
  va_list argp;
  if (tok == 0) {
    tokstr = NULL;
  } else if (tok == TK_name || tok == TK_string || tok == TK_number) {
    lex_save(ls, '\0');
    tokstr = ls->sb.b;
  } else {
    tokstr = lj_lex_token2str(ls, tok);
  }
  va_start(argp, em);
  lj_err_lex(ls->L, ls->chunkname, tokstr, ls->linenumber, em, argp);
  va_end(argp);
}